

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codegen.cc
# Opt level: O2

string * __thiscall
kratos::get_var_size_str_abi_cxx11_(string *__return_storage_ptr__,kratos *this,Var *var)

{
  SystemVerilogCodeGen *this_00;
  uint32_t width;
  undefined4 extraout_var;
  uint index;
  string local_48;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  for (index = 0; (ulong)index < (ulong)(*(long *)(this + 0xa8) - *(long *)(this + 0xa0) >> 2);
      index = index + 1) {
    this_00 = (SystemVerilogCodeGen *)Var::get_size_param((Var *)this,index);
    if (this_00 == (SystemVerilogCodeGen *)0x0) {
      SystemVerilogCodeGen::get_width_str_abi_cxx11_
                (&local_48,
                 (SystemVerilogCodeGen *)(ulong)*(uint *)(*(long *)(this + 0xa0) + (ulong)index * 4)
                 ,width);
      std::__cxx11::string::append((string *)__return_storage_ptr__);
    }
    else {
      SystemVerilogCodeGen::get_width_str_abi_cxx11_
                (&local_48,this_00,(Var *)CONCAT44(extraout_var,width));
      std::__cxx11::string::append((string *)__return_storage_ptr__);
    }
    std::__cxx11::string::~string((string *)&local_48);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string get_var_size_str(Var* var) {
    std::string str;
    for (uint32_t i = 0; i < var->size().size(); i++) {
        auto* p = var->get_size_param(i);
        if (p)
            str.append(SystemVerilogCodeGen::get_width_str(p));
        else
            str.append(SystemVerilogCodeGen::get_width_str(var->size()[i]));
    }
    return str;
}